

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Bmc_EsPar_t *pBVar3;
  int (*paiVar4) [32];
  long lVar5;
  long lVar6;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  iVar1 = p->pPars->nVars;
  lVar6 = (long)iVar1;
  if (iVar1 < p->nObjs) {
    paiVar4 = p->pFanins + lVar6;
    do {
      iVar1 = Zyx_ManCollectFanins(p,(int)lVar6);
      if (iVar1 != p->pPars->nLutSize) {
        __assert_fail("nFanins == p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x3e0,"int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *)");
      }
      pBVar3 = p->pPars;
      if (0 < pBVar3->nLutSize) {
        lVar5 = 0;
        do {
          iVar1 = p->TopoBase + (*paiVar4)[lVar5] + ((int)lVar6 - pBVar3->nVars) * p->nObjs;
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p_00,iVar1 * 2 + 1);
          lVar5 = lVar5 + 1;
          pBVar3 = p->pPars;
        } while (lVar5 < pBVar3->nLutSize);
      }
      lVar6 = lVar6 + 1;
      paiVar4 = paiVar4 + 1;
    } while (lVar6 < p->nObjs);
  }
  piVar2 = p_00->pArray;
  iVar1 = bmcg_sat_solver_addclause(p->pSat,piVar2,p_00->nSize);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Zyx_ManAddCnfBlockSolution( Zyx_Man_t * p )
{
    Vec_Int_t * vLits = Vec_IntAlloc( 100 ); int i, k;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        assert( nFanins == p->pPars->nLutSize );
        for ( k = 0; k < p->pPars->nLutSize; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(Zyx_TopoVar(p, i, p->pFanins[i][k]), 1) );
    }
    //Zyx_ManPrintVarMap( p, 1 );
    //Zyx_PrintClause( Vec_IntArray(vLits), Vec_IntSize(vLits) );
    if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
        return 0;
    Vec_IntFree( vLits );
    return 1;
}